

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_br89.c
# Opt level: O3

double br89_x_Q(double x,void *_rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = *_rhs;
  dVar3 = (x + x) / 3.0;
  dVar2 = 0.0;
  if (dVar3 <= 115.12925464970229) {
    dVar2 = exp(-dVar3);
  }
  return dVar2 * x - (x + -2.0) * dVar1;
}

Assistant:

GPU_FUNCTION static double
br89_x_Q(double x, void *_rhs)
{
  double rhs, xm2, arg, eee;
  rhs = *((double *)_rhs);

  xm2 = x - 2.0;
  arg = 2.0*x/3.0;
  eee = arg > log(1e50) ? 0 : exp(-arg);

  return x*eee - rhs*xm2;
}